

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_10.hpp
# Opt level: O0

type * boost::phoenix::
       expr_ext<boost::phoenix::actor,_boost::phoenix::detail::tag::function_eval,_boost::spirit::terminal<boost::spirit::tag::byte_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>_>,_0L>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
       ::make(type *__return_storage_ptr__,param_type a0,param_type a1)

{
  param_type a1_local;
  param_type a0_local;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::byte_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>_>,_0L>_>_>,_2L>_>
  *e;
  undefined1 local_78 [8];
  expr_type that;
  
  that.child1.proto_expr_.child0.t_ = (expr_type)(expr_type)a1;
  spirit::terminal<boost::spirit::tag::byte_>::terminal
            ((terminal<boost::spirit::tag::byte_> *)local_78,a0);
  that._0_8_ = *(undefined8 *)that.child1.proto_expr_.child0.t_;
  proto::exprns_::
  basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::byte_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>_>,_0L>_>_>,_2L>
  ::basic_expr(&__return_storage_ptr__->proto_expr_,
               (basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::byte_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>_>,_0L>_>_>,_2L>
                *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static type make(typename call_traits<A0>::param_type a0 , typename call_traits<A1>::param_type a1)
      { 
        
                actor<base_type> const e =
                {
                    proto::make_expr<
                        Tag
                      , phoenix_default_domain 
                    >(a0 , a1)
                };
            return e;
        }